

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fPolygonOffsetTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_0::UsageDisplacementTestCase::testPolygonOffset
          (UsageDisplacementTestCase *this)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  TestLog *log;
  RenderContext *pRVar2;
  TestContext *testCtx;
  UsageDisplacementTestCase *pUVar3;
  bool bVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 extraout_var;
  MessageBuilder *pMVar8;
  TestError *this_01;
  long lVar9;
  Vec4 *value;
  float fVar10;
  float local_338;
  allocator<char> local_332;
  allocator<char> local_331;
  long local_330;
  UsageDisplacementTestCase *local_328;
  ulong local_320;
  Surface referenceImage;
  Surface testImage;
  Vec4 triangle [3];
  string local_2b8;
  Random rnd;
  Vec4 retVal;
  ShaderProgram program;
  
  deRandom_init(&rnd.m_rnd,0xdec0de);
  log = ((this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
        ->m_log;
  iVar5 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface(&testImage,iVar5,iVar5);
  iVar5 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface(&referenceImage,iVar5,iVar5);
  iVar5 = (*((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  local_330 = CONCAT44(extraout_var,iVar5);
  pRVar2 = ((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)triangle,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,&local_331);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,
             "varying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_FragColor = v_color;\n}\n",
             &local_332);
  glu::makeVtxFragSources((ProgramSources *)&retVal,(string *)triangle,&local_2b8);
  glu::ShaderProgram::ShaderProgram(&program,pRVar2,(ProgramSources *)&retVal);
  local_328 = this;
  glu::ProgramSources::~ProgramSources((ProgramSources *)&retVal);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)triangle);
  lVar9 = local_330;
  uVar6 = (**(code **)(local_330 + 0x780))(program.m_program.m_program,"a_position");
  uVar7 = (**(code **)(lVar9 + 0x780))(program.m_program.m_program,"a_color");
  if (program.m_program.m_info.linkOk != false) {
    (**(code **)(lVar9 + 0x1c0))(0,0,0,0x3f800000);
    (**(code **)(lVar9 + 0x1d0))(0x3f800000);
    (**(code **)(lVar9 + 0x188))(0x4100);
    (**(code **)(lVar9 + 0x1a00))(0,0,(local_328->super_PolygonOffsetTestCase).m_targetSize);
    (**(code **)(lVar9 + 0x1680))(program.m_program.m_program);
    (**(code **)(lVar9 + 0x5e0))(0xb71);
    (**(code **)(lVar9 + 0x5e0))(0x8037);
    (**(code **)(lVar9 + 0x610))(uVar6);
    (**(code **)(lVar9 + 0x1858))(0,0x3f800000,0,0x3f800000,uVar7);
    poVar1 = (ostringstream *)(retVal.m_data + 2);
    retVal.m_data._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Framebuffer cleared, clear color = Black.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&retVal,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    poVar1 = (ostringstream *)(retVal.m_data + 2);
    retVal.m_data._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"POLYGON_OFFSET_FILL enabled.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&retVal,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    poVar1 = (ostringstream *)(retVal.m_data + 2);
    for (local_320 = 0; (int)local_320 != 0x28; local_320 = (ulong)((int)local_320 + 1)) {
      bVar4 = de::Random::getBool((Random *)&rnd.m_rnd);
      lVar9 = 0;
      do {
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)triangle[0].m_data + lVar9));
        lVar9 = lVar9 + 0x10;
      } while (lVar9 != 0x30);
      local_338 = -1.0;
      if (!bVar4) {
        local_338 = 1.0;
      }
      for (lVar9 = 0; lVar9 != 0x30; lVar9 = lVar9 + 0x10) {
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&retVal);
        fVar10 = deRandom_getFloat(&rnd.m_rnd);
        retVal.m_data[0] = fVar10 + fVar10 + -1.0;
        fVar10 = deRandom_getFloat(&rnd.m_rnd);
        retVal.m_data[1] = fVar10 + fVar10 + -1.0;
        retVal.m_data[2] = 0.5;
        fVar10 = deRandom_getFloat(&rnd.m_rnd);
        retVal.m_data[3] = fVar10 + 1.0;
        *(float *)((long)triangle[0].m_data + lVar9) = retVal.m_data[0];
        *(float *)((long)triangle[0].m_data + lVar9 + 4) = retVal.m_data[1];
        *(float *)((long)triangle[0].m_data + lVar9 + 8) = retVal.m_data[2];
        *(float *)((long)triangle[0].m_data + lVar9 + 0xc) = retVal.m_data[3];
      }
      (**(code **)(local_330 + 0x19f0))(uVar6,4,0x1406,0,0,triangle);
      retVal.m_data._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(retVal.m_data + 2));
      std::operator<<((ostream *)(retVal.m_data + 2),"Setup triangle with random coordinates:");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&retVal,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(retVal.m_data + 2));
      value = triangle;
      lVar9 = 3;
      while (bVar4 = lVar9 != 0, lVar9 = lVar9 + -1, bVar4) {
        retVal.m_data._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"\tx=");
        pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)&retVal,value->m_data);
        std::operator<<((ostream *)&pMVar8->m_str,"\ty=");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,value->m_data + 1);
        std::operator<<((ostream *)&pMVar8->m_str,"\tz=");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,value->m_data + 2);
        std::operator<<((ostream *)&pMVar8->m_str,"\tw=");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,value->m_data + 3);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        value = value + 1;
      }
      retVal.m_data._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(retVal.m_data + 2));
      std::operator<<((ostream *)(retVal.m_data + 2),
                      "Draw colorless triangle.\tState: DepthFunc = GL_ALWAYS, PolygonOffset(0, 0)."
                     );
      lVar9 = local_330;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&retVal,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(retVal.m_data + 2));
      (**(code **)(lVar9 + 0x4a0))(0x207);
      (**(code **)(lVar9 + 0x1028))(0,0);
      (**(code **)(lVar9 + 0x238))(0,0,0,0);
      (**(code **)(lVar9 + 0x538))(4,0,3);
      this_00 = (ostringstream *)(retVal.m_data + 2);
      retVal.m_data._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,
                      "Draw green triangle.\tState: DepthFunc = GL_EQUAL, PolygonOffset(0, ");
      std::ostream::operator<<(this_00,local_338);
      std::operator<<((ostream *)this_00,").");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&retVal,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      (**(code **)(lVar9 + 0x4a0))(0x202);
      (**(code **)(lVar9 + 0x1028))(0);
      (**(code **)(lVar9 + 0x238))(1,1,1);
      (**(code **)(lVar9 + 0x538))(4,0,3);
      retVal.m_data._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(retVal.m_data + 2));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&retVal,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(retVal.m_data + 2));
    }
    (**(code **)(lVar9 + 0x518))(uVar6);
    (**(code **)(lVar9 + 0x1680))(0);
    (**(code **)(lVar9 + 0x648))();
    pUVar3 = local_328;
    pRVar2 = ((local_328->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)&retVal,&testImage);
    glu::readPixels(pRVar2,0,0,(PixelBufferAccess *)&retVal);
    glu::ShaderProgram::~ShaderProgram(&program);
    poVar1 = (ostringstream *)(retVal.m_data + 2);
    retVal.m_data._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Expecting black framebuffer.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&retVal,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    tcu::Surface::getAccess((PixelBufferAccess *)&retVal,&referenceImage);
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
    tcu::clear((PixelBufferAccess *)&retVal,(Vec4 *)&program);
    testCtx = (pUVar3->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    pRVar2 = ((pUVar3->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)&retVal,&testImage);
    tcu::Surface::getAccess((PixelBufferAccess *)&program,&referenceImage);
    verifyImages(log,testCtx,pRVar2,(ConstPixelBufferAccess *)&retVal,
                 (ConstPixelBufferAccess *)&program);
    tcu::Surface::~Surface(&referenceImage);
    tcu::Surface::~Surface(&testImage);
    return;
  }
  glu::operator<<(log,&program);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Shader compile failed.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fPolygonOffsetTests.cpp"
             ,0x1f8);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void UsageDisplacementTestCase::testPolygonOffset (void)
{
	using tcu::TestLog;

	de::Random			rnd				(0xdec0de);
	tcu::TestLog&		log				= m_testCtx.getLog();
	tcu::Surface		testImage		(m_targetSize, m_targetSize);
	tcu::Surface		referenceImage	(m_targetSize, m_targetSize);

	// render test image
	{
		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const glu::ShaderProgram	program			(m_context.getRenderContext(), glu::makeVtxFragSources(s_shaderSourceVertex, s_shaderSourceFragment));
		const GLint					positionLoc		= gl.getAttribLocation(program.getProgram(), "a_position");
		const GLint					colorLoc		= gl.getAttribLocation(program.getProgram(), "a_color");
		const int					numIterations	= 40;

		if (!program.isOk())
		{
			log << program;
			TCU_FAIL("Shader compile failed.");
		}

		gl.clearColor				(0, 0, 0, 1);
		gl.clearDepthf				(1.0f);
		gl.clear					(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		gl.viewport					(0, 0, m_targetSize, m_targetSize);
		gl.useProgram				(program.getProgram());
		gl.enable					(GL_DEPTH_TEST);
		gl.enable					(GL_POLYGON_OFFSET_FILL);
		gl.enableVertexAttribArray	(positionLoc);
		gl.vertexAttrib4f			(colorLoc, 0.0f, 1.0f, 0.0f, 1.0f);

		log << TestLog::Message << "Framebuffer cleared, clear color = Black." << TestLog::EndMessage;
		log << TestLog::Message << "POLYGON_OFFSET_FILL enabled." << TestLog::EndMessage;

		// draw colorless (mask = 0,0,0) triangle at random* location, set offset and render green triangle with depthfunc = equal
		// *) w >= 1.0 and z in (-1, 1) range
		for (int iterationNdx = 0; iterationNdx < numIterations; ++iterationNdx)
		{
			const bool		offsetDirection = rnd.getBool();
			const float		offset = offsetDirection ? -1.0f : 1.0f;
			tcu::Vec4		triangle[3];

			for (int vertexNdx = 0; vertexNdx < DE_LENGTH_OF_ARRAY(triangle); ++vertexNdx)
				triangle[vertexNdx] = genRandomVec4(rnd);

			gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangle);

			log << TestLog::Message << "Setup triangle with random coordinates:" << TestLog::EndMessage;
			for (size_t ndx = 0; ndx < DE_LENGTH_OF_ARRAY(triangle); ++ndx)
				log << TestLog::Message
						<< "\tx=" << triangle[ndx].x()
						<< "\ty=" << triangle[ndx].y()
						<< "\tz=" << triangle[ndx].z()
						<< "\tw=" << triangle[ndx].w()
						<< TestLog::EndMessage;

			log << TestLog::Message << "Draw colorless triangle.\tState: DepthFunc = GL_ALWAYS, PolygonOffset(0, 0)." << TestLog::EndMessage;

			gl.depthFunc				(GL_ALWAYS);
			gl.polygonOffset			(0, 0);
			gl.colorMask				(GL_FALSE, GL_FALSE, GL_FALSE, GL_FALSE);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);

			// all fragments should have different Z => DepthFunc == GL_EQUAL fails with every fragment

			log << TestLog::Message << "Draw green triangle.\tState: DepthFunc = GL_EQUAL, PolygonOffset(0, " << offset << ")." << TestLog::EndMessage;

			gl.depthFunc				(GL_EQUAL);
			gl.polygonOffset			(0, offset);
			gl.colorMask				(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);

			log << TestLog::Message << TestLog::EndMessage; // empty line for clarity
		}

		gl.disableVertexAttribArray	(positionLoc);
		gl.useProgram				(0);
		gl.finish					();

		glu::readPixels(m_context.getRenderContext(), 0, 0, testImage.getAccess());
	}

	// render reference image
	log << TestLog::Message << "Expecting black framebuffer." << TestLog::EndMessage;
	tcu::clear(referenceImage.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	// compare
	verifyImages(log, m_testCtx, m_context.getRenderContext(), testImage.getAccess(), referenceImage.getAccess());
}